

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O0

bid_t docio_append_doc_raw(docio_handle *handle,uint64_t size,void *buf)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  bool bVar5;
  void *pvVar6;
  filemgr *pfVar7;
  size_t sVar8;
  int iVar9;
  fdb_status fVar10;
  uint64_t uVar11;
  bid_t bVar12;
  undefined8 *puVar13;
  uint16_t *puVar14;
  filemgr *unaff_RBX;
  err_log_callback *in_stack_00000010;
  char *apcStack_110 [3];
  char *local_f8;
  void *local_f0;
  filemgr *local_e8 [2];
  filemgr *in_stack_ffffffffffffff28;
  undefined8 uStack_d0;
  bool start_from_new_block;
  bool new_block;
  err_log_callback *peStack_c8;
  fdb_status fs_1;
  uint64_t remainsize;
  uint32_t remain;
  uint32_t nblock;
  uint16_t *bmp_revnum_list;
  bid_t block_list_size;
  bid_t *block_list;
  bid_t startpos;
  bid_t i;
  bid_t end;
  bid_t begin;
  ulong uStack_78;
  fdb_status fs;
  docblk_meta blk_meta;
  filemgr *pfStack_60;
  bool non_consecutive;
  err_log_callback *log_callback;
  size_t remaining_space;
  size_t real_blocksize;
  size_t blocksize;
  uint8_t marker [1];
  void *pvStack_38;
  uint32_t offset;
  void *buf_local;
  uint64_t size_local;
  docio_handle *handle_local;
  
  remaining_space = (size_t)handle->file->blocksize;
  pfStack_60 = (filemgr *)handle->log_callback;
  local_e8[1] = (filemgr *)0x130d8f;
  real_blocksize = remaining_space;
  pvStack_38 = buf;
  buf_local = (void *)size;
  size_local = (uint64_t)handle;
  blk_meta.marker = ver_non_consecutive_doc(handle->file->version);
  local_e8[1] = (filemgr *)0x130da4;
  memset(&stack0xffffffffffffff88,0,0x10);
  blk_meta.next_bid._7_1_ = 0xdd;
  if ((blk_meta.marker & 1) == 0) {
    real_blocksize = real_blocksize - 1;
  }
  else {
    real_blocksize = real_blocksize - 0x10;
  }
  local_e8[1] = (filemgr *)0x130ddb;
  memset((void *)((long)&blocksize + 3),0xdd,1);
  if (*(long *)(size_local + 8) == -1) {
    local_e8[1] = (filemgr *)0x130df2;
    uVar11 = filemgr_get_sb_bmp_revnum(in_stack_ffffffffffffff28);
    *(short *)(size_local + 0x14) = (short)uVar11;
    local_e8[1] = (filemgr *)0x130e13;
    bVar12 = filemgr_alloc((filemgr *)CONCAT44(remainsize._4_4_,(uint)remainsize),peStack_c8);
    *(bid_t *)(size_local + 8) = bVar12;
    *(undefined4 *)(size_local + 0x10) = 0;
  }
  local_e8[1] = (filemgr *)0x130e3d;
  iVar9 = filemgr_is_writable(_remain,CONCAT44(remainsize._4_4_,(uint)remainsize));
  if (iVar9 == 0) {
    if (*(uint *)(size_local + 0x10) < remaining_space) {
      local_e8[1] = (filemgr *)0x130e84;
      filemgr_mark_stale(pfStack_60,CONCAT17(blk_meta.marker,blk_meta._8_7_),
                         CONCAT17(blk_meta.next_bid._7_1_,
                                  CONCAT52(blk_meta.next_bid._2_5_,(ushort)blk_meta.next_bid)));
    }
    local_e8[1] = (filemgr *)0x130e90;
    uVar11 = filemgr_get_sb_bmp_revnum(in_stack_ffffffffffffff28);
    *(short *)(size_local + 0x14) = (short)uVar11;
    local_e8[1] = (filemgr *)0x130eb1;
    bVar12 = filemgr_alloc((filemgr *)CONCAT44(remainsize._4_4_,(uint)remainsize),peStack_c8);
    *(bid_t *)(size_local + 8) = bVar12;
    *(undefined4 *)(size_local + 0x10) = 0;
  }
  blk_meta.next_bid._0_2_ = *(ushort *)(size_local + 0x14) >> 8 | *(short *)(size_local + 0x14) << 8
  ;
  log_callback = (err_log_callback *)(real_blocksize - *(uint *)(size_local + 0x10));
  if (log_callback < buf_local) {
    bmp_revnum_list = (uint16_t *)0x0;
    remainsize._4_4_ = (int)((ulong)buf_local / real_blocksize);
    remainsize._0_4_ = (uint)((ulong)buf_local % real_blocksize);
    peStack_c8 = (err_log_callback *)buf_local;
    uStack_d0._4_4_ = FDB_RESULT_SUCCESS;
    block_list_size =
         (bid_t)(&stack0xffffffffffffff28 +
                -((ulong)(remainsize._4_4_ + 1) * 8 + 0xf & 0xfffffffffffffff0));
    puVar13 = (undefined8 *)
              (&stack0xffffffffffffff28 +
               -((ulong)(remainsize._4_4_ + 1) * 8 + 0xf & 0xfffffffffffffff0) +
              -((ulong)(remainsize._4_4_ + 1) * 2 + 0xf & 0xfffffffffffffff0));
    _remain = (filemgr *)puVar13;
    blocksize._4_4_ = (int)real_blocksize - *(int *)(size_local + 0x10);
    if ((blk_meta.marker & 1) == 0) {
      puVar13[-1] = 0x131656;
      bVar12 = filemgr_alloc_multiple_cond
                         ((filemgr *)puVar13[9],puVar13[8],*(int *)((long)puVar13 + 0x3c),
                          (bid_t *)puVar13[6],(bid_t *)puVar13[5],(err_log_callback *)puVar13[4]);
      pfVar7 = pfStack_60;
      if (bVar12 == *(long *)(size_local + 8) + 1U) {
        if (end != *(long *)(size_local + 8) + 1U) {
          fVar10 = (fdb_status)(ulong)(uint)uStack_d0._4_4_;
          lVar4 = *(long *)(size_local + 8);
          uVar2 = **(undefined8 **)size_local;
          puVar13[-4] = 
          "Error in allocating blocks starting from block id %lu in a database file \'%s\'";
          puVar13[-3] = lVar4 + 1;
          puVar13[-2] = uVar2;
          puVar13[-5] = 0x1316d9;
          fdb_log_impl((err_log_callback *)pfVar7,2,fVar10,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                       ,"docio_append_doc_raw",0x161);
          return 0xffffffffffffffff;
        }
        puVar13[-2] = pfStack_60;
        puVar13[-3] = 0x13171a;
        fVar10 = filemgr_write_offset
                           ((filemgr *)puVar13[0x18],puVar13[0x17],puVar13[0x16],puVar13[0x15],
                            (void *)puVar13[0x14],*(bool *)((long)puVar13 + 0x9f),
                            (err_log_callback *)puVar13[0x1d]);
        pfVar7 = pfStack_60;
        uStack_d0._4_4_ = fVar10;
        if (fVar10 != FDB_RESULT_SUCCESS) {
          uVar2 = *(undefined8 *)(size_local + 8);
          uVar3 = **(undefined8 **)size_local;
          puVar13[-4] = 
          "Error in appending a doc block marker for a block id %lu into a database file \'%s\'";
          puVar13[-3] = uVar2;
          puVar13[-2] = uVar3;
          puVar13[-5] = 0x131782;
          fdb_log_impl((err_log_callback *)pfVar7,2,(fdb_status)(ulong)(uint)fVar10,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                       ,"docio_append_doc_raw",0x16b);
          return 0xffffffffffffffff;
        }
        if (blocksize._4_4_ != 0) {
          puVar13[-2] = pfStack_60;
          puVar13[-3] = 0x1317d5;
          fVar10 = filemgr_write_offset
                             ((filemgr *)puVar13[0x18],puVar13[0x17],puVar13[0x16],puVar13[0x15],
                              (void *)puVar13[0x14],*(bool *)((long)puVar13 + 0x9f),
                              (err_log_callback *)puVar13[0x1d]);
          pvVar6 = buf_local;
          uVar1 = blocksize._4_4_;
          pfVar7 = pfStack_60;
          uStack_d0._4_4_ = fVar10;
          if (fVar10 != FDB_RESULT_SUCCESS) {
            uVar2 = *(undefined8 *)(size_local + 8);
            uVar3 = **(undefined8 **)size_local;
            puVar13[-6] = 
            "Error in writing a doc block with id %lu, offset %d, size %lu to a database file \'%s\'"
            ;
            puVar13[-5] = uVar2;
            *(uint *)(puVar13 + -4) = uVar1;
            puVar13[-3] = pvVar6;
            puVar13[-2] = uVar3;
            puVar13[-7] = 0x13184f;
            fdb_log_impl((err_log_callback *)pfVar7,2,(fdb_status)(ulong)(uint)fVar10,
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                         ,"docio_append_doc_raw",0x177);
            return 0xffffffffffffffff;
          }
        }
        peStack_c8 = (err_log_callback *)((long)peStack_c8 - (ulong)blocksize._4_4_);
        block_list = (bid_t *)(*(long *)(size_local + 8) * remaining_space +
                              (ulong)*(uint *)(size_local + 0x10));
      }
      else {
        if ((*(long *)(size_local + 8) != -1) && (*(uint *)(size_local + 0x10) < remaining_space)) {
          puVar13[-1] = 0x1318e4;
          filemgr_mark_stale((filemgr *)puVar13[0xf],puVar13[0xe],puVar13[0xd]);
        }
        puVar13[-1] = 0x13191a;
        filemgr_alloc_multiple
                  ((filemgr *)puVar13[7],*(int *)((long)puVar13 + 0x34),(bid_t *)puVar13[5],
                   (bid_t *)puVar13[4],(err_log_callback *)puVar13[3]);
        blocksize._4_4_ = 0;
        block_list = (bid_t *)(end * remaining_space);
      }
      puVar14 = (uint16_t *)((i - end) + 1);
      bmp_revnum_list = puVar14;
      for (startpos = 0; startpos < puVar14; startpos = startpos + 1) {
        *(bid_t *)(block_list_size + startpos * 8) = end + startpos;
      }
    }
    else {
      uStack_d0._3_1_ = 0;
      uStack_d0._2_1_ = 0;
      bVar5 = blocksize._4_4_ < (uint)remainsize;
      if (bVar5) {
        uStack_d0._3_1_ = 1;
      }
      bmp_revnum_list = (uint16_t *)(ulong)(remainsize._4_4_ + (uint)bVar5);
      uStack_d0._3_1_ = bVar5;
      for (startpos = 0; startpos < bmp_revnum_list; startpos = startpos + 1) {
        puVar13[-1] = 0x13124a;
        uVar11 = filemgr_get_sb_bmp_revnum((filemgr *)*puVar13);
        *(short *)((long)_remain + startpos * 2) = (short)uVar11;
        puVar13[-1] = 0x131275;
        bVar12 = filemgr_alloc((filemgr *)puVar13[3],(err_log_callback *)puVar13[2]);
        *(bid_t *)(block_list_size + startpos * 8) = bVar12;
        if ((((startpos == 0) && (*(long *)(size_local + 8) != -1)) &&
            (*(long *)(size_local + 8) + 1U < *(ulong *)block_list_size)) &&
           ((uStack_d0._2_1_ = 1, (uint)remainsize != 0 && ((uStack_d0._3_1_ & 1) == 0)))) {
          uStack_d0._3_1_ = 1;
          bmp_revnum_list = (uint16_t *)((long)bmp_revnum_list + 1);
        }
      }
      if ((blocksize._4_4_ == 0) || ((uStack_d0._2_1_ & 1) != 0)) {
        if ((*(long *)(size_local + 8) != -1) && (*(uint *)(size_local + 0x10) < remaining_space)) {
          puVar13[-1] = 0x1315ed;
          filemgr_mark_stale((filemgr *)puVar13[0xf],puVar13[0xe],puVar13[0xd]);
        }
        blocksize._4_4_ = 0;
        block_list = (bid_t *)(*(long *)block_list_size * remaining_space);
      }
      else {
        uStack_78 = *(ulong *)block_list_size >> 0x38 |
                    (*(ulong *)block_list_size & 0xff000000000000) >> 0x28 |
                    (*(ulong *)block_list_size & 0xff0000000000) >> 0x18 |
                    (*(ulong *)block_list_size & 0xff00000000) >> 8 |
                    (*(ulong *)block_list_size & 0xff000000) << 8 |
                    (*(ulong *)block_list_size & 0xff0000) << 0x18 |
                    (*(ulong *)block_list_size & 0xff00) << 0x28 | *(long *)block_list_size << 0x38;
        puVar13[-2] = pfStack_60;
        puVar13[-3] = 0x131426;
        fVar10 = filemgr_write_offset
                           ((filemgr *)puVar13[0x18],puVar13[0x17],puVar13[0x16],puVar13[0x15],
                            (void *)puVar13[0x14],*(bool *)((long)puVar13 + 0x9f),
                            (err_log_callback *)puVar13[0x1d]);
        pfVar7 = pfStack_60;
        uStack_d0._4_4_ = fVar10;
        if (fVar10 != FDB_RESULT_SUCCESS) {
          uVar2 = *(undefined8 *)(size_local + 8);
          uVar3 = **(undefined8 **)size_local;
          puVar13[-4] = 
          "Error in appending a doc block metadata for a block id %lu into a database file \'%s\'";
          puVar13[-3] = uVar2;
          puVar13[-2] = uVar3;
          puVar13[-5] = 0x13148e;
          fdb_log_impl((err_log_callback *)pfVar7,2,(fdb_status)(ulong)(uint)fVar10,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                       ,"docio_append_doc_raw",0x135);
          return 0xffffffffffffffff;
        }
        if (blocksize._4_4_ != 0) {
          puVar13[-2] = pfStack_60;
          puVar13[-3] = 0x1314e1;
          fVar10 = filemgr_write_offset
                             ((filemgr *)puVar13[0x18],puVar13[0x17],puVar13[0x16],puVar13[0x15],
                              (void *)puVar13[0x14],*(bool *)((long)puVar13 + 0x9f),
                              (err_log_callback *)puVar13[0x1d]);
          pvVar6 = buf_local;
          uVar1 = blocksize._4_4_;
          pfVar7 = pfStack_60;
          uStack_d0._4_4_ = fVar10;
          if (fVar10 != FDB_RESULT_SUCCESS) {
            uVar2 = *(undefined8 *)(size_local + 8);
            uVar3 = **(undefined8 **)size_local;
            puVar13[-6] = 
            "Error in writing a doc block with id %lu, offset %d, size %lu to a database file \'%s\'"
            ;
            puVar13[-5] = uVar2;
            *(uint *)(puVar13 + -4) = uVar1;
            puVar13[-3] = pvVar6;
            puVar13[-2] = uVar3;
            puVar13[-7] = 0x13155b;
            fdb_log_impl((err_log_callback *)pfVar7,2,(fdb_status)(ulong)(uint)fVar10,
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                         ,"docio_append_doc_raw",0x143);
            return 0xffffffffffffffff;
          }
        }
        peStack_c8 = (err_log_callback *)((long)peStack_c8 - (ulong)blocksize._4_4_);
        block_list = (bid_t *)(*(long *)(size_local + 8) * remaining_space +
                              (ulong)*(uint *)(size_local + 0x10));
      }
    }
    startpos = 0;
    while( true ) {
      if (bmp_revnum_list <= startpos) {
        return (bid_t)block_list;
      }
      *(undefined8 *)(size_local + 8) = *(undefined8 *)(block_list_size + startpos * 8);
      *(undefined2 *)(size_local + 0x14) = *(undefined2 *)((long)_remain + startpos * 2);
      blk_meta.next_bid._0_2_ =
           *(ushort *)(size_local + 0x14) >> 8 | *(short *)(size_local + 0x14) << 8;
      if ((blk_meta.marker & 1) != 0) {
        if (startpos < (long)bmp_revnum_list - 1U) {
          uStack_78 = *(ulong *)(block_list_size + 8 + startpos * 8) >> 0x38 |
                      (*(ulong *)(block_list_size + 8 + startpos * 8) & 0xff000000000000) >> 0x28 |
                      (*(ulong *)(block_list_size + 8 + startpos * 8) & 0xff0000000000) >> 0x18 |
                      (*(ulong *)(block_list_size + 8 + startpos * 8) & 0xff00000000) >> 8 |
                      (*(ulong *)(block_list_size + 8 + startpos * 8) & 0xff000000) << 8 |
                      (*(ulong *)(block_list_size + 8 + startpos * 8) & 0xff0000) << 0x18 |
                      (*(ulong *)(block_list_size + 8 + startpos * 8) & 0xff00) << 0x28 |
                      *(long *)(block_list_size + 8 + startpos * 8) << 0x38;
        }
        else {
          puVar13[-1] = 0x131b63;
          memset(&stack0xffffffffffffff88,0xff,8);
        }
      }
      if ((blk_meta.marker & 1) == 0) {
        puVar13[-2] = pfStack_60;
        puVar13[-3] = 0x131be1;
        uStack_d0._4_4_ =
             filemgr_write_offset
                       ((filemgr *)puVar13[0x18],puVar13[0x17],puVar13[0x16],puVar13[0x15],
                        (void *)puVar13[0x14],*(bool *)((long)puVar13 + 0x9f),
                        (err_log_callback *)puVar13[0x1d]);
      }
      else {
        puVar13[-2] = pfStack_60;
        puVar13[-3] = 0x131b9b;
        uStack_d0._4_4_ =
             filemgr_write_offset
                       ((filemgr *)puVar13[0x18],puVar13[0x17],puVar13[0x16],puVar13[0x15],
                        (void *)puVar13[0x14],*(bool *)((long)puVar13 + 0x9f),
                        (err_log_callback *)puVar13[0x1d]);
      }
      pfVar7 = pfStack_60;
      if (uStack_d0._4_4_ != FDB_RESULT_SUCCESS) break;
      if (peStack_c8 < real_blocksize) {
        if (startpos != (long)bmp_revnum_list - 1U) {
          puVar13[-1] = 0x131db8;
          fdb_assert_die((char *)puVar13[5],(char *)puVar13[4],*(int *)((long)puVar13 + 0x1c),
                         puVar13[2],puVar13[1]);
        }
        puVar13[-2] = pfStack_60;
        puVar13[-3] = 0x131e11;
        fVar10 = filemgr_write_offset
                           ((filemgr *)puVar13[0x18],puVar13[0x17],puVar13[0x16],puVar13[0x15],
                            (void *)puVar13[0x14],*(bool *)((long)puVar13 + 0x9f),
                            (err_log_callback *)puVar13[0x1d]);
        uVar11 = size_local;
        pfVar7 = pfStack_60;
        pvVar6 = peStack_c8;
        uStack_d0._4_4_ = fVar10;
        if (fVar10 != FDB_RESULT_SUCCESS) {
          uVar2 = *(undefined8 *)(block_list_size + startpos * 8);
          uVar3 = **(undefined8 **)size_local;
          puVar13[-4] = 
          "Error in writing a doc block with id %lu, size %lu to a database file \'%s\'";
          puVar13[-3] = uVar2;
          puVar13[-2] = pvVar6;
          puVar13[-1] = uVar3;
          puVar13[-5] = 0x131e8f;
          fdb_log_impl((err_log_callback *)pfVar7,2,(fdb_status)(ulong)(uint)fVar10,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                       ,"docio_append_doc_raw",0x1d5);
          return 0xffffffffffffffff;
        }
        blocksize._4_4_ = blocksize._4_4_ + (int)peStack_c8;
        *(int *)(size_local + 0x10) = (int)peStack_c8;
        bVar12 = *(bid_t *)(block_list_size + startpos * 8);
        uVar1 = *(uint *)(size_local + 0x10);
        puVar13[-1] = 0x131ee1;
        fVar10 = _docio_fill_zero((docio_handle *)uVar11,bVar12,(ulong)uVar1);
        if (fVar10 != FDB_RESULT_SUCCESS) {
          return 0xffffffffffffffff;
        }
      }
      else {
        puVar13[-2] = pfStack_60;
        puVar13[-3] = 0x131cb5;
        fVar10 = filemgr_write_offset
                           ((filemgr *)puVar13[0x18],puVar13[0x17],puVar13[0x16],puVar13[0x15],
                            (void *)puVar13[0x14],*(bool *)((long)puVar13 + 0x9f),
                            (err_log_callback *)puVar13[0x1d]);
        sVar8 = real_blocksize;
        pfVar7 = pfStack_60;
        uStack_d0._4_4_ = fVar10;
        if (fVar10 != FDB_RESULT_SUCCESS) {
          uVar2 = *(undefined8 *)(block_list_size + startpos * 8);
          uVar3 = **(undefined8 **)size_local;
          puVar13[-4] = 
          "Error in writing an entire doc block with id %lu, size %lu to a database file \'%s\'";
          puVar13[-3] = uVar2;
          puVar13[-2] = sVar8;
          puVar13[-1] = uVar3;
          puVar13[-5] = 0x131d30;
          fdb_log_impl((err_log_callback *)pfVar7,2,(fdb_status)(ulong)(uint)fVar10,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                       ,"docio_append_doc_raw",0x1c2);
          return 0xffffffffffffffff;
        }
        blocksize._4_4_ = blocksize._4_4_ + (int)real_blocksize;
        peStack_c8 = (err_log_callback *)((long)peStack_c8 - real_blocksize);
        *(int *)(size_local + 0x10) = (int)real_blocksize;
      }
      startpos = startpos + 1;
    }
    fVar10 = (fdb_status)(ulong)(uint)uStack_d0._4_4_;
    uVar2 = *(undefined8 *)(block_list_size + startpos * 8);
    uVar3 = **(undefined8 **)size_local;
    puVar13[-4] = 
    "Error in appending a doc block marker for a block id %lu into a database file \'%s\'";
    puVar13[-3] = uVar2;
    puVar13[-2] = uVar3;
    puVar13[-5] = 0x131c53;
    fdb_log_impl((err_log_callback *)pfVar7,2,fVar10,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                 ,"docio_append_doc_raw",0x1b3);
    return 0xffffffffffffffff;
  }
  begin._4_4_ = 0;
  uVar1 = *(uint *)(size_local + 0x10);
  blocksize._7_1_ = SUB41(uVar1 >> 0x18,0);
  bVar5 = blocksize._7_1_;
  blocksize._4_4_ = uVar1;
  if ((blk_meta.marker & 1) == 0) {
    local_e8[0] = pfStack_60;
    local_f0 = (void *)0x130f98;
    begin._4_4_ = filemgr_write_offset
                            (unaff_RBX,(bid_t)handle_local,size_local,(uint64_t)buf_local,pvStack_38
                             ,bVar5,in_stack_00000010);
  }
  else {
    uStack_78 = 0xffffffffffffffff;
    local_e8[0] = pfStack_60;
    local_f0 = (void *)0x130f5f;
    begin._4_4_ = filemgr_write_offset
                            (unaff_RBX,(bid_t)handle_local,size_local,(uint64_t)buf_local,pvStack_38
                             ,bVar5,in_stack_00000010);
  }
  if (begin._4_4_ != FDB_RESULT_SUCCESS) {
    local_f0 = *(void **)(size_local + 8);
    local_e8[0] = (filemgr *)**(undefined8 **)size_local;
    local_f8 = 
    "Error in appending a doc block marker for a block id %lu into a database file \'%s\'";
    apcStack_110[2] = (char *)0x130ff7;
    fdb_log_impl((err_log_callback *)pfStack_60,2,(fdb_status)(ulong)(uint)begin._4_4_,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                 ,"docio_append_doc_raw",0xac);
    return 0xffffffffffffffff;
  }
  local_e8[0] = pfStack_60;
  local_f0 = (void *)0x13104a;
  begin._4_4_ = filemgr_write_offset
                          (unaff_RBX,(bid_t)handle_local,size_local,(uint64_t)buf_local,pvStack_38,
                           blocksize._7_1_,in_stack_00000010);
  if (begin._4_4_ != FDB_RESULT_SUCCESS) {
    apcStack_110[2] = *(char **)(size_local + 8);
    local_e8[0] = (filemgr *)**(undefined8 **)size_local;
    apcStack_110[1] =
         "Error in writing a doc block with id %lu, offset %d, size %lu to a database file \'%s\'";
    local_f8 = (char *)CONCAT44(local_f8._4_4_,blocksize._4_4_);
    local_f0 = buf_local;
    apcStack_110[0] = (char *)0x1310bb;
    fdb_log_impl((err_log_callback *)pfStack_60,2,(fdb_status)(ulong)(uint)begin._4_4_,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                 ,"docio_append_doc_raw",0xb5);
    return 0xffffffffffffffff;
  }
  *(int *)(size_local + 0x10) = *(int *)(size_local + 0x10) + (int)buf_local;
  local_e8[1] = (filemgr *)0x1310f7;
  fVar10 = _docio_fill_zero((docio_handle *)size_local,*(bid_t *)(size_local + 8),
                            (ulong)*(uint *)(size_local + 0x10));
  if (fVar10 != FDB_RESULT_SUCCESS) {
    return 0xffffffffffffffff;
  }
  return *(long *)(size_local + 8) * remaining_space + (ulong)blocksize._4_4_;
}

Assistant:

bid_t docio_append_doc_raw(struct docio_handle *handle, uint64_t size, void *buf)
{
    uint32_t offset;
    uint8_t marker[BLK_MARKER_SIZE];
    size_t blocksize = handle->file->blocksize;
    size_t real_blocksize = blocksize;
    size_t remaining_space;
    err_log_callback *log_callback = handle->log_callback;
    bool non_consecutive = ver_non_consecutive_doc(handle->file->version);
    struct docblk_meta blk_meta;

    memset(&blk_meta, 0x0, sizeof(blk_meta));
    blk_meta.marker = BLK_MARKER_DOC;
    (void)blk_meta;

#ifdef __CRC32
    if (non_consecutive) {
        // new version: support non-consecutive document block
        blocksize -= DOCBLK_META_SIZE;
    } else {
        // old version: block marker only
        blocksize -= BLK_MARKER_SIZE;
    }
    memset(marker, BLK_MARKER_DOC, BLK_MARKER_SIZE);
#endif

    if (handle->curblock == BLK_NOT_FOUND) {
        // allocate new block
        handle->cur_bmp_revnum_hash =
            filemgr_get_sb_bmp_revnum(handle->file) & BMP_REVNUM_MASK;
        handle->curblock = filemgr_alloc(handle->file, log_callback);
        handle->curpos = 0;
    }
    if (!filemgr_is_writable(handle->file, handle->curblock)) {
        // mark remaining space in old block as stale
        if (handle->curpos < real_blocksize) {
            // this function will calculate block marker size automatically.
            filemgr_mark_stale(handle->file,
                               real_blocksize * handle->curblock + handle->curpos,
                               blocksize - handle->curpos);
        }
        // allocate new block
        handle->cur_bmp_revnum_hash =
            filemgr_get_sb_bmp_revnum(handle->file) & BMP_REVNUM_MASK;
        handle->curblock = filemgr_alloc(handle->file, log_callback);
        handle->curpos = 0;
    }
    blk_meta.sb_bmp_revnum_hash = _endian_encode(handle->cur_bmp_revnum_hash);

    remaining_space = blocksize - handle->curpos;
    if (size <= remaining_space) {
        fdb_status fs = FDB_RESULT_SUCCESS;
        // simply append to current block
        offset = handle->curpos;

        if (non_consecutive) {
            // set next BID
            blk_meta.next_bid = BLK_NOT_FOUND;
            // write meta
            fs = filemgr_write_offset(handle->file, handle->curblock,
                                      blocksize, sizeof(blk_meta), &blk_meta,
                                      false, log_callback);
        } else {
            fs = _add_blk_marker(handle->file, handle->curblock, blocksize, marker,
                                 log_callback);
        }


        if (fs != FDB_RESULT_SUCCESS) {
            fdb_log(log_callback, FDB_LOG_ERROR, fs,
                    "Error in appending a doc block marker for a block id %" _F64
                    " into a database file '%s'", handle->curblock,
                    handle->file->filename);
            return BLK_NOT_FOUND;
        }
        fs = filemgr_write_offset(handle->file, handle->curblock, offset, size,
                                  buf, (size == remaining_space), log_callback);
        if (fs != FDB_RESULT_SUCCESS) {
            fdb_log(log_callback, FDB_LOG_ERROR, fs,
                    "Error in writing a doc block with id %" _F64 ", offset %d, size %"
                    _F64 " to a database file '%s'", handle->curblock, offset, size,
                    handle->file->filename);
            return BLK_NOT_FOUND;
        }
        handle->curpos += size;

        if (_docio_fill_zero(handle, handle->curblock, handle->curpos) !=
            FDB_RESULT_SUCCESS) {
            return BLK_NOT_FOUND;
        }

        return handle->curblock * real_blocksize + offset;

    } else { // insufficient space to fit entire document into current block
        bid_t begin, end, i, startpos;
        bid_t *block_list, block_list_size = 0;
        uint16_t *bmp_revnum_list;
        uint32_t nblock = size / blocksize;
        uint32_t remain = size % blocksize;
        uint64_t remainsize = size;
        fdb_status fs = FDB_RESULT_SUCCESS;

        // as blocks may not be consecutive, we need to maintain
        // the list of BIDs.
        block_list = (bid_t *)alca(bid_t, nblock+1);
        bmp_revnum_list = (uint16_t *)alca(uint16_t, nblock+1);

#ifdef DOCIO_BLOCK_ALIGN
        offset = blocksize - handle->curpos;
        if (remain <= blocksize - handle->curpos &&
            filemgr_alloc_multiple_cond(handle->file, handle->curblock+1,
                                        nblock + ((remain>offset)?1:0), &begin, &end,
                                        log_callback) == handle->curblock+1) {

            // start from current block
            if (begin != (handle->curblock + 1)) {
                fdb_log(log_callback, FDB_LOG_ERROR, fs,
                        "Error in allocating blocks starting from block id %" _F64
                        " in a database file '%s'", handle->curblock + 1,
                        handle->file->filename);
                return BLK_NOT_FOUND;
            }

            fs = _add_blk_marker(handle->file, handle->curblock, blocksize,
                                 marker, log_callback);
            if (fs != FDB_RESULT_SUCCESS) {
                fdb_log(log_callback, FDB_LOG_ERROR, fs,
                        "Error in appending a doc block marker for a block id %" _F64
                        " into a database file '%s'", handle->curblock,
                        handle->file->filename);
                return BLK_NOT_FOUND;
            }
            if (offset > 0) {
                fs = filemgr_write_offset(handle->file, handle->curblock,
                                          handle->curpos, offset, buf,
                                          true, // mark block as immutable
                                          log_callback);
                if (fs != FDB_RESULT_SUCCESS) {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Error in writing a doc block with id %" _F64 ", offset %d, "
                            "size %" _F64 " to a database file '%s'", handle->curblock,
                            offset, size, handle->file->filename);
                    return BLK_NOT_FOUND;
                }
            }
            remainsize -= offset;

            startpos = handle->curblock * real_blocksize + handle->curpos;
        } else {
            // next block to be allocated is not continuous .. allocate new multiple blocks
            filemgr_alloc_multiple(handle->file, nblock+((remain>0)?1:0),
                                   &begin, &end, log_callback);
            offset = 0;

            startpos = begin * real_blocksize;
        }

#else
        // Simple append mode
        // The given doc is appended at the byte offset right next the last doc.
        // Note that block allocation can be non-consecutive.
        offset = blocksize - handle->curpos;

        if (non_consecutive) {
            // new version: support non-consecutive allocation

            bool new_block = false;
            bool start_from_new_block = false;

            if (remain > offset) {
                // if the current block cannot accommodate the remaining length
                // of the document, allocate an additional block.
                new_block = true;
            }

            block_list_size = nblock + ((new_block)?1:0);
            for (i=0; i<block_list_size; ++i) {
                bmp_revnum_list[i] = filemgr_get_sb_bmp_revnum(handle->file) &
                                     BMP_REVNUM_MASK;
                block_list[i] = filemgr_alloc(handle->file, log_callback);

                if (i == 0 && handle->curblock != BLK_NOT_FOUND &&
                    block_list[i] > handle->curblock+1) {
                    // if the first new allocated block is not consecutive
                    // from the current block, start writing document from
                    // the new block.
                    start_from_new_block = true;
                    // since we won't write into the current block,
                    // allocate one more block if necessary.
                    if (remain && !new_block) {
                        new_block = true;
                        block_list_size++;
                    }
                }
            }

            if (offset > 0 && !start_from_new_block) {
                // start from the current block

                // set next BID
                blk_meta.next_bid = _endian_encode(block_list[0]);
                // write meta
                fs = filemgr_write_offset(handle->file, handle->curblock,
                                          blocksize, sizeof(blk_meta), &blk_meta,
                                          false, log_callback);
                if (fs != FDB_RESULT_SUCCESS) {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Error in appending a doc block metadata for a block id %" _F64
                            " into a database file '%s'", handle->curblock,
                            handle->file->filename);
                    return BLK_NOT_FOUND;
                }

                // write the front part of the doc
                if (offset > 0) {
                    fs = filemgr_write_offset(handle->file, handle->curblock,
                                              handle->curpos, offset, buf,
                                              true, // mark block as immutable
                                              log_callback);
                    if (fs != FDB_RESULT_SUCCESS) {
                        fdb_log(log_callback, FDB_LOG_ERROR, fs,
                                "Error in writing a doc block with id %" _F64 ", offset %d, "
                                "size %" _F64 " to a database file '%s'", handle->curblock,
                                offset, size, handle->file->filename);
                        return BLK_NOT_FOUND;
                    }
                }
                remainsize -= offset;

                startpos = handle->curblock * real_blocksize + handle->curpos;
            } else {
                // mark remaining space in the current block as stale
                if (handle->curblock != BLK_NOT_FOUND &&
                    handle->curpos < real_blocksize) {
                    filemgr_mark_stale(handle->file,
                                       real_blocksize * handle->curblock + handle->curpos,
                                       blocksize - handle->curpos);
                }
                offset = 0;
                startpos = block_list[0] * real_blocksize;
            }

        } else {
            // old version: consecutive allocation only

            if (filemgr_alloc_multiple_cond(handle->file, handle->curblock+1,
                                            nblock + ((remain>offset)?1:0), &begin, &end,
                                            log_callback) == handle->curblock+1) {
                // start from current block
                if (begin != (handle->curblock + 1)) {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Error in allocating blocks starting from block id %" _F64
                            " in a database file '%s'", handle->curblock + 1,
                            handle->file->filename);
                    return BLK_NOT_FOUND;
                }

                fs = _add_blk_marker(handle->file, handle->curblock, blocksize,
                                     marker, log_callback);
                if (fs != FDB_RESULT_SUCCESS) {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Error in appending a doc block marker for a block id %" _F64
                            " into a database file '%s'", handle->curblock,
                            handle->file->filename);
                    return BLK_NOT_FOUND;
                }
                if (offset > 0) {
                    fs = filemgr_write_offset(handle->file, handle->curblock,
                                              handle->curpos, offset, buf,
                                              true, // mark block as immutable
                                              log_callback);
                    if (fs != FDB_RESULT_SUCCESS) {
                        fdb_log(log_callback, FDB_LOG_ERROR, fs,
                                "Error in writing a doc block with id %" _F64 ", offset %d, "
                                "size %" _F64 " to a database file '%s'", handle->curblock,
                                offset, size, handle->file->filename);
                        return BLK_NOT_FOUND;
                    }
                }
                remainsize -= offset;

                startpos = handle->curblock * real_blocksize + handle->curpos;
            } else {
                // next block to be allocated is not continuous
                // mark remaining space in the old block as stale
                if (handle->curblock != BLK_NOT_FOUND &&
                    handle->curpos < real_blocksize) {
                    filemgr_mark_stale(handle->file,
                                       real_blocksize * handle->curblock + handle->curpos,
                                       blocksize - handle->curpos);
                }
                // allocate new multiple blocks
                filemgr_alloc_multiple(handle->file, nblock+((remain>0)?1:0),
                                       &begin, &end, log_callback);
                offset = 0;

                startpos = begin * real_blocksize;
            }

            block_list_size = end - begin + 1;
            for (i=0; i<block_list_size; ++i) {
                block_list[i] = begin+i;
            }

        } // if (non_consecutive)

#endif

        for (i=0; i<block_list_size; ++i) {
            handle->curblock = block_list[i];
            handle->cur_bmp_revnum_hash = bmp_revnum_list[i];
            blk_meta.sb_bmp_revnum_hash = _endian_encode(handle->cur_bmp_revnum_hash);

            if (non_consecutive) {
                if (i < block_list_size - 1) {
                    blk_meta.next_bid = _endian_encode(block_list[i+1]);
                } else {
                    // the last block .. set next BID '0xffff...'
                    memset(&blk_meta.next_bid, 0xff, sizeof(blk_meta.next_bid));
                }
            }

            // write meta (new) or block marker (old)
            if (non_consecutive) {
                fs = filemgr_write_offset(handle->file, handle->curblock,
                                          blocksize, sizeof(blk_meta), &blk_meta,
                                          false, log_callback);
            } else {
                fs = _add_blk_marker(handle->file, block_list[i], blocksize, marker,
                                     log_callback);
            }
            if (fs != FDB_RESULT_SUCCESS) {
                fdb_log(log_callback, FDB_LOG_ERROR, fs,
                        "Error in appending a doc block marker for a block "
                        "id %" _F64 " into a database file '%s'", block_list[i],
                        handle->file->filename);
                return BLK_NOT_FOUND;
            }

            if (remainsize >= blocksize) {
                // write entire block

                fs = filemgr_write_offset(handle->file, block_list[i], 0, blocksize,
                                          (uint8_t *)buf + offset,
                                          true, // mark block as immutable
                                          log_callback);
                if (fs != FDB_RESULT_SUCCESS) {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Error in writing an entire doc block with id %" _F64
                            ", size %" _F64 " to a database file '%s'", block_list[i], blocksize,
                            handle->file->filename);
                    return BLK_NOT_FOUND;
                }
                offset += blocksize;
                remainsize -= blocksize;
                handle->curpos = blocksize;

            } else {
                // write rest of document
                fdb_assert(i==block_list_size-1, i, block_list_size-1);

                fs = filemgr_write_offset(handle->file, block_list[i], 0, remainsize,
                                          (uint8_t *)buf + offset,
                                          (remainsize == blocksize),
                                          log_callback);
                if (fs != FDB_RESULT_SUCCESS) {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Error in writing a doc block with id %" _F64 ", "
                            "size %" _F64 " to a database file '%s'", block_list[i], remainsize,
                            handle->file->filename);
                    return BLK_NOT_FOUND;
                }
                offset += remainsize;
                handle->curpos = remainsize;

                if (_docio_fill_zero(handle, block_list[i], handle->curpos) !=
                    FDB_RESULT_SUCCESS) {
                    return BLK_NOT_FOUND;
                }
            }
        }

        return startpos;
    }

    return 0;
}